

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::DistantLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DistantLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined1 auVar4 [16];
  bool bVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [56];
  undefined1 auVar23 [64];
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  SampledSpectrum SVar36;
  float local_98;
  float fStack_94;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar9 = ZEXT816(0) << 0x40;
  auVar8._0_4_ = auVar19._0_4_ * 0.0;
  auVar8._4_4_ = auVar19._4_4_ * 0.0;
  auVar8._8_4_ = auVar19._8_4_ * 0.0;
  auVar8._12_4_ = auVar19._12_4_ * 0.0;
  auVar19 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar8 = vfmadd213ps_fma(auVar19,auVar9,auVar8);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  local_78._0_4_ = auVar19._0_4_ + auVar8._0_4_;
  local_78._4_4_ = auVar19._4_4_ + auVar8._4_4_;
  fStack_70 = auVar19._8_4_ + auVar8._8_4_;
  fStack_6c = auVar19._12_4_ + auVar8._12_4_;
  auVar19._0_4_ = (float)local_78._0_4_ * (float)local_78._0_4_;
  auVar19._4_4_ = (float)local_78._4_4_ * (float)local_78._4_4_;
  auVar19._8_4_ = fStack_70 * fStack_70;
  auVar19._12_4_ = fStack_6c * fStack_6c;
  auVar19 = vhaddps_avx(auVar19,auVar19);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           ZEXT816(0) << 0x40,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  fVar25 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar12 = auVar19._0_4_ + fVar25 * fVar25;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
    auVar9 = ZEXT816(0) << 0x40;
  }
  else {
    auVar19 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    fVar12 = auVar19._0_4_;
  }
  auVar10._0_4_ = u1.super_Tuple2<pbrt::Point2,_float>.x + u1.super_Tuple2<pbrt::Point2,_float>.x;
  auVar10._4_4_ = u1.super_Tuple2<pbrt::Point2,_float>.y + u1.super_Tuple2<pbrt::Point2,_float>.y;
  auVar10._8_4_ = in_register_00001208._0_4_ + in_register_00001208._0_4_;
  auVar10._12_4_ = in_register_00001208._4_4_ + in_register_00001208._4_4_;
  auVar4._8_4_ = 0xbf800000;
  auVar4._0_8_ = 0xbf800000bf800000;
  auVar4._12_4_ = 0xbf800000;
  auVar8 = vaddps_avx512vl(auVar10,auVar4);
  auVar19 = vmovshdup_avx(auVar8);
  fVar13 = auVar8._0_4_;
  fVar7 = auVar19._0_4_;
  if ((((fVar13 != 0.0) || (NAN(fVar13))) || (fVar7 != 0.0)) || (NAN(fVar7))) {
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(auVar8,auVar9);
    auVar19 = vshufps_avx(auVar9,auVar9,0xf5);
    bVar5 = auVar19._0_4_ < auVar9._0_4_;
    auVar11._0_4_ = fVar13 / fVar7;
    auVar11._4_12_ = auVar8._4_12_;
    auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar11,ZEXT416(0x3fc90fdb));
    fVar6 = (float)((uint)bVar5 * (int)((fVar7 / fVar13) * 0.7853982) + (uint)!bVar5 * auVar19._0_4_
                   );
    fVar7 = (float)((uint)bVar5 * (int)fVar13 + (uint)!bVar5 * (int)fVar7);
    fVar13 = cosf(fVar6);
    fVar6 = sinf(fVar6);
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar7 * fVar13)),ZEXT416((uint)(fVar7 * fVar6)),0x10);
  }
  fVar7 = this->scale;
  auVar14._4_4_ = fVar12;
  auVar14._0_4_ = fVar12;
  auVar14._8_4_ = fVar12;
  auVar14._12_4_ = fVar12;
  auVar19 = vdivps_avx(_local_78,auVar14);
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  fVar32 = auVar19._0_4_;
  fVar33 = auVar19._4_4_;
  auVar20._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
  fVar34 = auVar19._8_4_;
  auVar20._8_4_ = -fVar34;
  fVar35 = auVar19._12_4_;
  auVar20._12_4_ = -fVar35;
  auVar30._8_4_ = 0x3f800000;
  auVar30._0_8_ = 0x3f8000003f800000;
  auVar30._12_4_ = 0x3f800000;
  fVar25 = fVar25 / fVar12;
  auVar10 = vpternlogd_avx512vl(auVar30,ZEXT416((uint)fVar25),auVar15,0xf8);
  fVar29 = auVar10._0_4_;
  fVar18 = -1.0 / (fVar25 + fVar29);
  auVar8 = vmovshdup_avx(auVar19);
  fVar12 = this->sceneRadius;
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  fVar27 = auVar9._0_4_;
  auVar21._0_4_ = fVar32 * fVar27;
  auVar21._4_4_ = fVar33 * auVar9._4_4_;
  auVar21._8_4_ = fVar34 * auVar9._8_4_;
  auVar21._12_4_ = fVar35 * auVar9._12_4_;
  auVar4 = vmovshdup_avx(auVar21);
  auVar24 = (undefined1  [56])0x0;
  fVar13 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar17 = (undefined1  [56])0x0;
  SVar36 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar23._0_8_ = SVar36.values.values._8_8_;
  auVar23._8_56_ = auVar24;
  auVar16._0_8_ = SVar36.values.values._0_8_;
  auVar16._8_56_ = auVar17;
  auVar19 = vmovlhps_avx(auVar16._0_16_,auVar23._0_16_);
  fVar6 = fVar18 * fVar32 * auVar8._0_4_;
  auVar11 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar29 * fVar6)),ZEXT416((uint)fVar6));
  auVar8 = vshufps_avx(auVar9,auVar9,0xe1);
  auVar26._0_4_ = fVar32 * fVar32 * fVar29;
  auVar26._4_4_ = fVar33 * 0.0;
  auVar26._8_4_ = fVar34 * 0.0;
  auVar26._12_4_ = fVar35 * 0.0;
  auVar28._4_4_ = fVar18;
  auVar28._0_4_ = fVar18;
  auVar28._8_4_ = fVar18;
  auVar28._12_4_ = fVar18;
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar10 = vunpcklps_avx(auVar31,auVar10);
  auVar10 = vfmadd231ps_fma(auVar10,auVar26,auVar28);
  auVar22._0_4_ =
       fVar32 * fVar12 +
       fVar12 * (fVar32 * 0.0 + auVar11._0_4_ * auVar8._0_4_ + fVar27 * auVar10._0_4_) +
       (float)uVar1;
  auVar22._4_4_ =
       fVar33 * fVar12 +
       fVar12 * (fVar33 * 0.0 + auVar11._4_4_ * auVar8._4_4_ + auVar9._4_4_ * auVar10._4_4_) +
       (float)uVar3;
  auVar22._8_4_ =
       fVar34 * fVar12 +
       fVar12 * (fVar34 * 0.0 + auVar11._8_4_ * auVar8._8_4_ + auVar9._8_4_ * auVar10._8_4_) + 0.0;
  auVar22._12_4_ =
       fVar35 * fVar12 +
       fVar12 * (fVar35 * 0.0 + auVar11._12_4_ * auVar8._12_4_ + auVar9._12_4_ * auVar10._12_4_) +
       0.0;
  fVar6 = this->sceneRadius;
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar19._0_4_ * fVar7;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar19._4_4_ * fVar7;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar19._8_4_ * fVar7;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar19._12_4_ * fVar7;
  uVar2 = vmovlps_avx(auVar22);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       fVar12 * fVar25 +
       fVar12 * (fVar25 * 0.0 + (fVar32 * -fVar29 * fVar27 - auVar4._0_4_)) + fVar13;
  uVar2 = vmovlps_avx(auVar20);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = -fVar25;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
       1.0 / (fVar6 * fVar6 * 3.1415927);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x94) = 0x3f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DistantLight::SampleLe(Point2f u1, Point2f u2,
                                                     SampledWavelengths &lambda,
                                                     Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray, 1 / (Pi * Sqr(sceneRadius)),
                         1);
}